

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O3

void QtPromisePrivate::PromiseDispatch<void>::
     call<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>,tst_qpromise_finally::rejectedThrows()::__0>
               (QPromiseResolve<void> *resolve,QPromiseReject<void> *reject,
               anon_class_8_1_a8c68091 fn)

{
  undefined8 *puVar1;
  QByteArrayView QVar2;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x18);
  QVar2.m_data = (storage_type *)0x3;
  QVar2.m_size = (qsizetype)&local_30;
  QString::fromUtf8(QVar2);
  *puVar1 = local_30;
  puVar1[1] = local_28;
  puVar1[2] = local_20;
  __cxa_throw(puVar1,&QString::typeinfo,QString::~QString);
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            fn(std::forward<Args>(args)...);
            resolve();
        } catch (...) {
            reject(std::current_exception());
        }
    }